

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch.hpp
# Opt level: O0

string * Catch::fpToString<float>(float value,int precision)

{
  ostream *this;
  void *this_00;
  long lVar1;
  long lVar2;
  char *pcVar3;
  int in_ESI;
  string *in_RDI;
  float in_XMM0_Da;
  size_t i;
  ostringstream oss;
  string *d;
  string local_1c8 [32];
  long local_1a8;
  undefined1 local_19d;
  int local_18c;
  ostringstream local_188 [376];
  int local_10;
  float local_c;
  
  local_10 = in_ESI;
  local_c = in_XMM0_Da;
  std::__cxx11::ostringstream::ostringstream(local_188);
  local_18c = (int)std::setprecision(local_10);
  this = std::operator<<((ostream *)local_188,(_Setprecision)local_18c);
  this_00 = (void *)std::ostream::operator<<(this,std::fixed);
  std::ostream::operator<<(this_00,local_c);
  local_19d = 0;
  std::__cxx11::ostringstream::str();
  lVar1 = std::__cxx11::string::find_last_not_of((char)in_RDI,0x30);
  local_1a8 = lVar1;
  if ((lVar1 != -1) && (lVar2 = std::__cxx11::string::size(), lVar1 != lVar2 + -1)) {
    pcVar3 = (char *)std::__cxx11::string::operator[]((ulong)in_RDI);
    if (*pcVar3 == '.') {
      local_1a8 = local_1a8 + 1;
    }
    std::__cxx11::string::substr((ulong)local_1c8,(ulong)in_RDI);
    std::__cxx11::string::operator=(in_RDI,local_1c8);
    std::__cxx11::string::~string(local_1c8);
  }
  local_19d = 1;
  std::__cxx11::ostringstream::~ostringstream(local_188);
  return in_RDI;
}

Assistant:

std::string fpToString( T value, int precision ) {
    std::ostringstream oss;
    oss << std::setprecision( precision )
        << std::fixed
        << value;
    std::string d = oss.str();
    std::size_t i = d.find_last_not_of( '0' );
    if( i != std::string::npos && i != d.size()-1 ) {
        if( d[i] == '.' )
            i++;
        d = d.substr( 0, i+1 );
    }
    return d;
}